

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

Identity * __thiscall CoreML::Specification::Model::mutable_identity(Model *this)

{
  PipelineClassifier *this_00;
  
  if (this->_oneof_case_[0] == 900) {
    this_00 = (this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 900;
    this_00 = (PipelineClassifier *)operator_new(0x18);
    Identity::Identity((Identity *)this_00);
    (this->Type_).identity_ = (Identity *)this_00;
  }
  return (Identity *)this_00;
}

Assistant:

inline ::CoreML::Specification::Identity* Model::mutable_identity() {
  if (!has_identity()) {
    clear_Type();
    set_has_identity();
    Type_.identity_ = new ::CoreML::Specification::Identity;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.identity)
  return Type_.identity_;
}